

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GenerateIndexKey(Parse *pParse,Index *pIdx,int iCur,int regOut,int doMakeRec)

{
  ushort uVar1;
  int p1;
  int p2;
  Vdbe *p;
  Table *pTab;
  char *zP4;
  int p2_00;
  int p3;
  ulong uVar2;
  
  p = pParse->pVdbe;
  pTab = pIdx->pTable;
  uVar1 = pIdx->nColumn;
  p2_00 = uVar1 + 1;
  if ((int)(uint)uVar1 < pParse->nRangeReg) {
    p1 = pParse->iRangeReg;
    pParse->iRangeReg = p1 + p2_00;
    pParse->nRangeReg = pParse->nRangeReg - p2_00;
  }
  else {
    p1 = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + p2_00;
  }
  sqlite3VdbeAddOp3(p,0x41,iCur,p1 + (uint)uVar1,0);
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      p2 = pIdx->aiColumn[uVar2];
      p3 = p1 + (int)uVar2;
      if (p2 == pTab->iPKey) {
        sqlite3VdbeAddOp3(p,0xf,p1 + (uint)uVar1,p3,0);
      }
      else {
        sqlite3VdbeAddOp3(p,0x1d,iCur,p2,p3);
        sqlite3ColumnDefault(p,pTab,p2,-1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (doMakeRec != 0) {
    if ((pTab->pSelect == (Select *)0x0) && ((pParse->db->dbOptFlags & 0x10) == 0)) {
      zP4 = sqlite3IndexAffinityStr(p,pIdx);
    }
    else {
      zP4 = (char *)0x0;
    }
    sqlite3VdbeAddOp3(p,0x1f,p1,p2_00,regOut);
    sqlite3VdbeChangeP4(p,-1,zP4,0);
  }
  sqlite3ExprCacheRemove(pParse,p1,p2_00);
  if (pParse->nRangeReg <= (int)(uint)uVar1) {
    pParse->nRangeReg = p2_00;
    pParse->iRangeReg = p1;
  }
  return p1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,     /* Parsing context */
  Index *pIdx,       /* The index for which to generate a key */
  int iCur,          /* Cursor number for the pIdx->pTable table */
  int regOut,        /* Write the new index key to this register */
  int doMakeRec      /* Run the OP_MakeRecord instruction if true */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  Table *pTab = pIdx->pTable;
  int regBase;
  int nCol;

  nCol = pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol+1);
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regBase+nCol);
  for(j=0; j<nCol; j++){
    int idx = pIdx->aiColumn[j];
    if( idx==pTab->iPKey ){
      sqlite3VdbeAddOp2(v, OP_SCopy, regBase+nCol, regBase+j);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, iCur, idx, regBase+j);
      sqlite3ColumnDefault(v, pTab, idx, -1);
    }
  }
  if( doMakeRec ){
    const char *zAff;
    if( pTab->pSelect
     || OptimizationDisabled(pParse->db, SQLITE_IdxRealAsInt)
    ){
      zAff = 0;
    }else{
      zAff = sqlite3IndexAffinityStr(v, pIdx);
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol+1, regOut);
    sqlite3VdbeChangeP4(v, -1, zAff, P4_TRANSIENT);
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol+1);
  return regBase;
}